

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int16_t mode_context_analyzer(int16_t mode_context,MV_REFERENCE_FRAME *rf)

{
  int local_24;
  int16_t comp_ctx;
  int16_t refmv_ctx;
  int16_t newmv_ctx;
  MV_REFERENCE_FRAME *rf_local;
  int16_t mode_context_local;
  uint16_t local_2;
  
  local_2 = mode_context;
  if ('\0' < rf[1]) {
    if ((mode_context & 7U) < 4) {
      local_24 = (int)(short)(mode_context & 7U);
    }
    else {
      local_24 = 4;
    }
    local_2 = compound_mode_ctx_map[(int)(short)(mode_context >> 4 & 0xf) >> 1][local_24];
  }
  return local_2;
}

Assistant:

static inline int16_t mode_context_analyzer(
    const int16_t mode_context, const MV_REFERENCE_FRAME *const rf) {
  if (rf[1] <= INTRA_FRAME) return mode_context;

  const int16_t newmv_ctx = mode_context & NEWMV_CTX_MASK;
  const int16_t refmv_ctx = (mode_context >> REFMV_OFFSET) & REFMV_CTX_MASK;

  const int16_t comp_ctx = compound_mode_ctx_map[refmv_ctx >> 1][AOMMIN(
      newmv_ctx, COMP_NEWMV_CTXS - 1)];
  return comp_ctx;
}